

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O1

StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
* __thiscall
google::protobuf::json_internal::JsonLexer::ParseUtf8
          (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
           *__return_storage_ptr__,JsonLexer *this)

{
  JsonLocation *pJVar1;
  int iVar2;
  size_t sVar3;
  ushort uVar4;
  bool bVar5;
  undefined8 uVar6;
  ZeroCopyInputStream *pZVar7;
  char cVar8;
  byte bVar9;
  uint uVar10;
  char *pcVar11;
  ZeroCopyBufferedStream *pZVar12;
  Status *this_00;
  string_view sVar13;
  Status _status_2;
  Status _status;
  string on_heap;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  JsonLocation loc;
  undefined1 local_158 [8];
  undefined1 local_150 [16];
  undefined1 local_140 [32];
  undefined1 local_120 [16];
  undefined1 local_110 [64];
  ZeroCopyBufferedStream *local_d0;
  ZeroCopyInputStream *local_c8;
  undefined1 local_c0 [41];
  uint7 uStack_97;
  size_t sStack_90;
  ZeroCopyBufferedStream local_88;
  
  SkipToToken((JsonLexer *)local_120);
  uVar6 = local_120._0_8_;
  if ((ZeroCopyBufferedStream *)local_120._0_8_ != (ZeroCopyBufferedStream *)0x1) {
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::StatusOrData<const_absl::lts_20240722::Status,_0>
              (&__return_storage_ptr__->
                super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               ,(Status *)local_120);
  }
  if ((local_120._0_8_ & 1) == 0) {
    absl::lts_20240722::status_internal::StatusRep::Unref();
  }
  if ((ZeroCopyBufferedStream *)uVar6 == (ZeroCopyBufferedStream *)0x1) {
    cVar8 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
    pJVar1 = &this->json_loc_;
    if ((cVar8 == '\'') && ((this->options_).allow_legacy_syntax == false)) {
      JsonLocation::Invalid((JsonLocation *)local_120,pJVar1,0xc,"expected \'\"\'");
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::StatusOrData<absl::lts_20240722::Status,_0>
                (&__return_storage_ptr__->
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 ,(Status *)local_120);
      if ((local_120._0_8_ & 1) == 0) {
        absl::lts_20240722::status_internal::StatusRep::Unref();
      }
    }
    else {
      local_88._48_4_ = *(undefined4 *)&pJVar1->offset;
      local_88._52_4_ = *(undefined4 *)((long)&(this->json_loc_).offset + 4);
      local_88.cursor_._0_4_ = (undefined4)(this->json_loc_).line;
      local_88.cursor_._4_4_ = *(undefined4 *)((long)&(this->json_loc_).line + 4);
      local_88.buffer_start_._0_4_ = *(undefined4 *)&(this->json_loc_).col;
      local_88.buffer_start_._4_4_ = *(undefined4 *)((long)&(this->json_loc_).col + 4);
      local_88._72_4_ = *(undefined4 *)&(this->json_loc_).path;
      local_88.outstanding_buffer_borrows_ = *(int *)((long)&(this->json_loc_).path + 4);
      pcVar11 = "\'";
      if (cVar8 != '\'') {
        pcVar11 = "\"";
      }
      Expect((JsonLexer *)local_120,this,1,pcVar11);
      if ((ZeroCopyBufferedStream *)local_120._0_8_ == (ZeroCopyBufferedStream *)0x1) {
        local_d0 = (ZeroCopyBufferedStream *)local_c0;
        local_c8 = (ZeroCopyInputStream *)0x0;
        local_c0[0] = 0;
        ZeroCopyBufferedStream::BeginMark(&local_88);
        local_88.last_chunk_._M_str = (char *)pJVar1->offset;
        local_88.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(this->json_loc_).line;
        local_88.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)(this->json_loc_).col;
        local_88.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(this->json_loc_).path;
        local_c0._20_4_ = (uint)(cVar8 == '\'') * 5 + 0x22;
LAB_002bf793:
        do {
          ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)local_120,(size_t)this);
          if ((ZeroCopyBufferedStream *)local_120._0_8_ == (ZeroCopyBufferedStream *)0x1) {
            local_150._0_8_ = (ZeroCopyBufferedStream *)0x1;
          }
          else {
            local_150._0_8_ = local_120._0_8_;
            local_120._0_8_ = (ZeroCopyBufferedStream *)0x37;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                    ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)local_120);
          if ((ZeroCopyBufferedStream *)local_150._0_8_ != (ZeroCopyBufferedStream *)0x1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_150);
LAB_002c0081:
            this_00 = (Status *)local_150;
LAB_002c009c:
            absl::lts_20240722::Status::~Status(this_00);
            break;
          }
          bVar9 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
          Advance((JsonLexer *)local_120,(size_t)this);
          pZVar7 = local_c8;
          if ((ZeroCopyBufferedStream *)local_120._0_8_ != (ZeroCopyBufferedStream *)0x1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_120);
LAB_002c0097:
            this_00 = (Status *)local_120;
            goto LAB_002c009c;
          }
          cVar8 = (char)(string *)&local_d0;
          if ((bVar9 == 0x22) || (bVar9 == 0x27)) {
            if (local_c0._20_4_ == (int)(char)bVar9) {
              if (local_c8 == (ZeroCopyInputStream *)0x0) {
                sVar3 = *(size_t *)(local_88.last_chunk_._M_len + 0x38);
                local_140._0_8_ = ~(ulong)local_88.stream_ + sVar3;
                if ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len !=
                    (ZeroCopyBufferedStream *)0x0) {
                  iVar2 = *(int *)(local_88.last_chunk_._M_len + 0x4c);
                  *(int *)(local_88.last_chunk_._M_len + 0x4c) = iVar2 + 1;
                  if (iVar2 == 0) {
                    *(size_t *)(local_88.last_chunk_._M_len + 0x40) = sVar3;
                  }
                  *(int *)(local_88.last_chunk_._M_len + 0x4c) = iVar2 + 2;
                  if (iVar2 + 1 == 0) {
                    *(size_t *)(local_88.last_chunk_._M_len + 0x40) = sVar3;
                  }
                }
                local_140[0x10] = 1;
                local_150._8_8_ = local_88.stream_;
                local_150._0_8_ = local_88.last_chunk_._M_len;
                local_140._24_8_ = local_150._0_8_;
                if ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len !=
                    (ZeroCopyBufferedStream *)0x0) {
                  ZeroCopyBufferedStream::DownRefBuffer
                            ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len);
                }
              }
              else {
                pZVar12 = (ZeroCopyBufferedStream *)(local_c0 + 0x28);
                if (local_d0 == (ZeroCopyBufferedStream *)local_c0) {
                  sStack_90 = local_c0._8_8_;
                  local_c0._24_8_ = pZVar12;
                }
                else {
                  local_c0._24_8_ = local_d0;
                }
                stack0xffffffffffffff68 = (MessagePath *)CONCAT71(local_c0._1_7_,local_c0[0]);
                local_150._0_8_ = local_140;
                local_c8 = (ZeroCopyInputStream *)0x0;
                local_c0[0] = 0;
                if ((ZeroCopyBufferedStream *)local_c0._24_8_ == pZVar12) {
                  local_140._8_8_ = sStack_90;
                }
                else {
                  local_150._0_8_ = local_c0._24_8_;
                }
                local_140._0_8_ = stack0xffffffffffffff68;
                local_150._8_8_ = pZVar7;
                local_c0._32_8_ = (MessagePath *)0x0;
                stack0xffffffffffffff68 = (MessagePath *)((ulong)(uint7)local_c0._1_7_ << 8);
                local_140[0x10] = 0;
                local_140._24_8_ = (ZeroCopyBufferedStream *)0x0;
                local_d0 = (ZeroCopyBufferedStream *)local_c0;
                local_c0._24_8_ = pZVar12;
              }
              if ((pZVar7 != (ZeroCopyInputStream *)0x0) &&
                 ((ZeroCopyBufferedStream *)local_c0._24_8_ !=
                  (ZeroCopyBufferedStream *)(local_c0 + 0x28))) {
                operator_delete((void *)local_c0._24_8_,(ulong)((long)stack0xffffffffffffff68 + 1));
              }
              sVar13 = MaybeOwnedString::AsView((MaybeOwnedString *)local_150);
              cVar8 = utf8_range::IsStructurallyValid(sVar13._M_len,sVar13._M_str);
              if (cVar8 == '\0') {
                JsonLocation::Invalid((JsonLocation *)local_120,pJVar1,0x14,"Invalid UTF-8 string");
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOrData<absl::lts_20240722::Status,_0>
                          (&__return_storage_ptr__->
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           ,(Status *)local_120);
                if ((local_120._0_8_ & 1) == 0) {
                  absl::lts_20240722::status_internal::StatusRep::Unref();
                }
              }
              else {
                local_110[0x10] = local_140[0x10];
                local_158 = (undefined1  [8])local_120;
                (*std::__detail::__variant::
                  __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&&>
                  ::_S_vtable._M_arr[local_140[0x10]]._M_data)
                          ((anon_class_8_1_a78179b7_conflict2 *)local_158,
                           (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                            *)local_150);
                local_110._24_8_ = local_140._24_8_;
                if (((ZeroCopyBufferedStream *)local_140._24_8_ != (ZeroCopyBufferedStream *)0x0) &&
                   (iVar2 = *(int *)(local_140._24_8_ + 0x4c),
                   *(int *)(local_140._24_8_ + 0x4c) = iVar2 + 1, iVar2 == 0)) {
                  *(size_t *)(local_140._24_8_ + 0x40) = *(size_t *)(local_140._24_8_ + 0x38);
                }
                local_110._48_4_ = (undefined4)local_88.buffer_start_;
                local_110._52_4_ = local_88.buffer_start_._4_4_;
                local_110._56_4_ = local_88._72_4_;
                local_110._60_4_ = local_88.outstanding_buffer_borrows_;
                local_110._32_4_ = local_88._48_4_;
                local_110._36_4_ = local_88._52_4_;
                local_110._40_4_ = (undefined4)local_88.cursor_;
                local_110._44_4_ = local_88.cursor_._4_4_;
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                ::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                          ((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>>
                            *)__return_storage_ptr__);
                if ((ZeroCopyBufferedStream *)local_110._24_8_ != (ZeroCopyBufferedStream *)0x0) {
                  ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_110._24_8_);
                  local_110._24_8_ = (ZeroCopyBufferedStream *)0x0;
                }
                (*std::__detail::__variant::
                  __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
                  ::_S_vtable._M_arr[(byte)local_110[0x10]]._M_data)
                          ((anon_class_1_0_00000001 *)local_158,
                           (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                            *)local_120);
              }
              if ((ZeroCopyBufferedStream *)local_140._24_8_ != (ZeroCopyBufferedStream *)0x0) {
                ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_140._24_8_);
                local_140._24_8_ = (ZeroCopyBufferedStream *)0x0;
              }
              (*std::__detail::__variant::
                __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
                ::_S_vtable._M_arr[local_140[0x10]]._M_data)
                        ((anon_class_1_0_00000001 *)local_120,
                         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                          *)local_150);
              break;
            }
LAB_002bf8a9:
            if (((byte)(bVar9 + 1) < 0x21) && ((this->options_).allow_legacy_syntax == false)) {
              local_150._8_8_ =
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_char>;
              local_150._0_8_ = (ZeroCopyBufferedStream *)(ulong)bVar9;
              absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                        (local_120,"invalid control character 0x%02x in string",0x2a,local_150,1);
              JsonLocation::Invalid
                        ((JsonLocation *)local_158,pJVar1,local_120._8_8_,local_120._0_8_);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_158);
              if (((ulong)local_158 & 1) == 0) {
                absl::lts_20240722::status_internal::StatusRep::Unref();
              }
              if ((ZeroCopyBufferedStream *)local_120._0_8_ != (ZeroCopyBufferedStream *)local_110)
              {
                operator_delete((void *)local_120._0_8_,(ulong)(local_110._0_8_ + 1));
              }
              break;
            }
            uVar4 = 0xf;
            if ((byte)~bVar9 != 0) {
              for (; (byte)~bVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            uVar10 = (uVar4 ^ 0xf) - 8;
            if (bVar9 == 0xff) {
              uVar10 = 8;
            }
            if ((4 < uVar10) || ((0x1dU >> (uVar10 & 0x1f) & 1) == 0)) {
              JsonLocation::Invalid((JsonLocation *)local_120,pJVar1,0x17,"invalid UTF-8 in string")
              ;
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_120);
              if ((local_120._0_8_ & 1) == 0) {
                absl::lts_20240722::status_internal::StatusRep::Unref();
              }
              break;
            }
            sVar3 = *(size_t *)(&DAT_003e8eb0 + (ulong)uVar10 * 8);
            if (local_c8 != (ZeroCopyInputStream *)0x0) {
              std::__cxx11::string::push_back(cVar8);
            }
            ZeroCopyBufferedStream::Take
                      ((StatusOr<google::protobuf::json_internal::MaybeOwnedString> *)local_120,
                       &this->stream_,sVar3);
            pZVar12 = (ZeroCopyBufferedStream *)local_120._0_8_;
            local_150._0_8_ = local_120._0_8_;
            if ((local_120._0_8_ & 1) == 0) {
              LOCK();
              *(int *)local_120._0_8_ = *(int *)local_120._0_8_ + 1;
              UNLOCK();
            }
            if ((ZeroCopyBufferedStream *)local_120._0_8_ != (ZeroCopyBufferedStream *)0x1) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::StatusOrData<const_absl::lts_20240722::Status,_0>
                        (&__return_storage_ptr__->
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,(Status *)local_150);
              absl::lts_20240722::Status::~Status((Status *)local_150);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::~StatusOrData
                        ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)
                         local_120);
              break;
            }
            if (local_c8 != (ZeroCopyInputStream *)0x0) {
              sVar13 = MaybeOwnedString::AsView((MaybeOwnedString *)(local_120 + 8));
              std::__cxx11::string::append((char *)&local_d0,(ulong)sVar13._M_str);
            }
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::MaybeOwnedString>::~StatusOrData
                      ((StatusOrData<google::protobuf::json_internal::MaybeOwnedString> *)local_120)
            ;
LAB_002bf97d:
            if (pZVar12 != (ZeroCopyBufferedStream *)0x1) break;
            goto LAB_002bf793;
          }
          if (bVar9 != 0x5c) goto LAB_002bf8a9;
          if (local_c8 == (ZeroCopyInputStream *)0x0) {
            sVar3 = *(size_t *)(local_88.last_chunk_._M_len + 0x38);
            local_110._0_8_ = ~(ulong)local_88.stream_ + sVar3;
            if ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len !=
                (ZeroCopyBufferedStream *)0x0) {
              iVar2 = *(int *)(local_88.last_chunk_._M_len + 0x4c);
              *(int *)(local_88.last_chunk_._M_len + 0x4c) = iVar2 + 1;
              if (iVar2 == 0) {
                *(size_t *)(local_88.last_chunk_._M_len + 0x40) = sVar3;
              }
              *(int *)(local_88.last_chunk_._M_len + 0x4c) = iVar2 + 2;
              if (iVar2 + 1 == 0) {
                *(size_t *)(local_88.last_chunk_._M_len + 0x40) = sVar3;
              }
            }
            local_110[0x10] = 1;
            local_120._8_8_ = local_88.stream_;
            local_120._0_8_ = local_88.last_chunk_._M_len;
            local_110._24_8_ = local_120._0_8_;
            if ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len !=
                (ZeroCopyBufferedStream *)0x0) {
              ZeroCopyBufferedStream::DownRefBuffer
                        ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len);
            }
            sVar13 = MaybeOwnedString::AsView((MaybeOwnedString *)local_120);
            local_150._0_8_ = (ZeroCopyBufferedStream *)local_140;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_150,sVar13._M_str,sVar13._M_str + sVar13._M_len);
            std::__cxx11::string::operator=((string *)&local_d0,(string *)local_150);
            if ((ZeroCopyBufferedStream *)local_150._0_8_ != (ZeroCopyBufferedStream *)local_140) {
              operator_delete((void *)local_150._0_8_,(ulong)(local_140._0_8_ + 1));
            }
            if ((ZeroCopyBufferedStream *)local_110._24_8_ != (ZeroCopyBufferedStream *)0x0) {
              ZeroCopyBufferedStream::DownRefBuffer((ZeroCopyBufferedStream *)local_110._24_8_);
              local_110._24_8_ = (ZeroCopyBufferedStream *)0x0;
            }
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>_&>
              ::_S_vtable._M_arr[(byte)local_110[0x10]]._M_data)
                      ((anon_class_1_0_00000001 *)local_158,
                       (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
                        *)local_120);
            Mark::Discard((Mark *)&local_88);
          }
          ZeroCopyBufferedStream::BufferAtLeast((ZeroCopyBufferedStream *)local_120,(size_t)this);
          if ((ZeroCopyBufferedStream *)local_120._0_8_ == (ZeroCopyBufferedStream *)0x1) {
            local_150._0_8_ = (ZeroCopyBufferedStream *)0x1;
          }
          else {
            local_150._0_8_ = local_120._0_8_;
            local_120._0_8_ = (ZeroCopyBufferedStream *)0x37;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::BufferingGuard>::~StatusOrData
                    ((StatusOrData<google::protobuf::json_internal::BufferingGuard> *)local_120);
          if ((ZeroCopyBufferedStream *)local_150._0_8_ != (ZeroCopyBufferedStream *)0x1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_150);
            goto LAB_002c0081;
          }
          bVar9 = ZeroCopyBufferedStream::PeekChar(&this->stream_);
          Advance((JsonLexer *)local_120,(size_t)this);
          if ((ZeroCopyBufferedStream *)local_120._0_8_ != (ZeroCopyBufferedStream *)0x1) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_120);
            goto LAB_002c0097;
          }
          if (bVar9 < 0x62) {
            if (bVar9 < 0x2f) {
              if ((bVar9 != 0x22) &&
                 ((bVar9 != 0x27 || ((this->options_).allow_legacy_syntax == false))))
              goto switchD_002bfaf2_caseD_6f;
            }
            else if (bVar9 != 0x2f) {
              if ((bVar9 == 0x55) && ((this->options_).allow_legacy_syntax == true))
              goto switchD_002bfaf2_caseD_75;
              if (bVar9 != 0x5c) goto switchD_002bfaf2_caseD_6f;
            }
            goto LAB_002bfbfb;
          }
          switch(bVar9) {
          case 0x6e:
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
switchD_002bfaf2_caseD_6f:
            bVar5 = true;
            goto LAB_002bfbfd;
          case 0x72:
            break;
          case 0x74:
            break;
          case 0x75:
switchD_002bfaf2_caseD_75:
            std::__cxx11::string::resize((ulong)&local_d0,(char)local_c8 + '\x04');
            ParseUnicodeEscape((JsonLexer *)local_120,(char *)this);
            pZVar12 = (ZeroCopyBufferedStream *)local_120._0_8_;
            local_150._0_8_ = local_120._0_8_;
            if ((local_120._0_8_ & 1) == 0) {
              LOCK();
              *(int *)local_120._0_8_ = *(int *)local_120._0_8_ + 1;
              UNLOCK();
            }
            if ((ZeroCopyBufferedStream *)local_120._0_8_ == (ZeroCopyBufferedStream *)0x1) {
              std::__cxx11::string::resize
                        ((ulong)&local_d0,(char)local_c8 + (char)local_120._8_8_ + -4);
              absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                        ((StatusOrData<unsigned_long> *)local_120);
              goto LAB_002bf97d;
            }
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<const_absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_150);
            absl::lts_20240722::Status::~Status((Status *)local_150);
            absl::lts_20240722::internal_statusor::StatusOrData<unsigned_long>::~StatusOrData
                      ((StatusOrData<unsigned_long> *)local_120);
            goto LAB_002c0018;
          default:
            if ((bVar9 != 0x62) && (bVar9 != 0x66)) goto switchD_002bfaf2_caseD_6f;
          }
LAB_002bfbfb:
          bVar5 = false;
LAB_002bfbfd:
          if (bVar5) {
            local_150._8_8_ = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<char>
            ;
            local_150._0_8_ = (ZeroCopyBufferedStream *)(ulong)bVar9;
            absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                      ((JsonLexer *)local_120,"invalid escape char: \'%c\'",0x19,local_150,1);
            JsonLocation::Invalid((JsonLocation *)local_158,pJVar1,local_120._8_8_,local_120._0_8_);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOrData<absl::lts_20240722::Status,_0>
                      (&__return_storage_ptr__->
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,(Status *)local_158);
            if (((ulong)local_158 & 1) == 0) {
              absl::lts_20240722::status_internal::StatusRep::Unref();
            }
            if ((ZeroCopyBufferedStream *)local_120._0_8_ != (ZeroCopyBufferedStream *)local_110) {
              operator_delete((void *)local_120._0_8_,(ulong)(local_110._0_8_ + 1));
            }
          }
          else {
            std::__cxx11::string::push_back(cVar8);
          }
        } while (!bVar5);
LAB_002c0018:
        if ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len != (ZeroCopyBufferedStream *)0x0)
        {
          ZeroCopyBufferedStream::DownRefBuffer
                    ((ZeroCopyBufferedStream *)local_88.last_chunk_._M_len);
          local_88.last_chunk_._M_len = 0;
        }
        if (local_d0 != (ZeroCopyBufferedStream *)local_c0) {
          operator_delete(local_d0,CONCAT71(local_c0._1_7_,local_c0[0]) + 1);
        }
      }
      else {
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOrData<const_absl::lts_20240722::Status,_0>
                  (&__return_storage_ptr__->
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   ,(Status *)local_120);
        absl::lts_20240722::Status::~Status((Status *)local_120);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<LocationWith<MaybeOwnedString>> JsonLexer::ParseUtf8() {
  RETURN_IF_ERROR(SkipToToken());
  // This is a non-standard extension accepted by the ESF parser that we will
  // need to accept for backwards-compat.
  bool is_single_quote = stream_.PeekChar() == '\'';
  if (!options_.allow_legacy_syntax && is_single_quote) {
    return Invalid("expected '\"'");
  }

  JsonLocation loc = json_loc_;
  RETURN_IF_ERROR(Expect(is_single_quote ? "'" : "\""));

  // on_heap is empty if we do not need to heap-allocate the string.
  std::string on_heap;
  LocationWith<Mark> mark = BeginMark();
  while (true) {
    RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

    char c = stream_.PeekChar();
    RETURN_IF_ERROR(Advance(1));
    switch (c) {
      case '"':
      case '\'': {
        if (c != (is_single_quote ? '\'' : '"')) {
          goto normal_character;
        }

        // NOTE: the 1 below clips off the " from the end of the string.
        MaybeOwnedString result = on_heap.empty()
                                      ? mark.value.UpToUnread(1)
                                      : MaybeOwnedString{std::move(on_heap)};
        if (utf8_range::IsStructurallyValid(result)) {
          return LocationWith<MaybeOwnedString>{std::move(result), loc};
        }
        return Invalid("Invalid UTF-8 string");
      }
      case '\\': {
        if (on_heap.empty()) {
          // The 1 skips over the `\`.
          on_heap = std::string(mark.value.UpToUnread(1).AsView());
          // Clang-tidy incorrectly notes this as being moved-from multiple
          // times, but it can only occur in one loop iteration. The mark is
          // destroyed only if we need to handle an escape when on_heap is
          // empty. Because this branch unconditionally pushes to on_heap, this
          // condition can never be reached in any iteration that follows it.
          // Thus, at most one move ever actually occurs.
          std::move(mark).value.Discard();
        }
        RETURN_IF_ERROR(stream_.BufferAtLeast(1).status());

        char c = stream_.PeekChar();
        RETURN_IF_ERROR(Advance(1));
        if (c == 'u' || (c == 'U' && options_.allow_legacy_syntax)) {
          // Ensure there is actual space to scribble the UTF-8 onto.
          on_heap.resize(on_heap.size() + 4);
          auto written = ParseUnicodeEscape(&on_heap[on_heap.size() - 4]);
          RETURN_IF_ERROR(written.status());
          on_heap.resize(on_heap.size() - 4 + *written);
        } else {
          char escape = ParseSimpleEscape(c, options_.allow_legacy_syntax);
          if (escape == 0) {
            return Invalid(absl::StrFormat("invalid escape char: '%c'", c));
          }
          on_heap.push_back(escape);
        }
        break;
      }
      normal_character:
      default: {
        uint8_t uc = static_cast<uint8_t>(c);
        // If people have newlines in their strings, that's their problem; it
        // is too difficult to support correctly in our location tracking, and
        // is out of spec, so users will get slightly wrong locations in errors.
        if ((uc < 0x20 || uc == 0xff) && !options_.allow_legacy_syntax) {
          return Invalid(absl::StrFormat(
              "invalid control character 0x%02x in string", uc));
        }

        // Process this UTF-8 code point. We do not need to fully validate it
        // at this stage; we just need to interpret it enough to know how many
        // bytes to read. UTF-8 is a varint encoding satisfying one of the
        // following (big-endian) patterns:
        //
        // 0b0xxxxxxx
        // 0b110xxxxx'10xxxxxx
        // 0b1110xxxx'10xxxxxx'10xxxxxx
        // 0b11110xxx'10xxxxxx'10xxxxxx'10xxxxxx
        size_t lookahead = 0;
        switch (absl::countl_one(uc)) {
          case 0:
            break;
          case 2:
            lookahead = 1;
            break;
          case 3:
            lookahead = 2;
            break;
          case 4:
            lookahead = 3;
            break;
          default:
            return Invalid("invalid UTF-8 in string");
        }

        if (!on_heap.empty()) {
          on_heap.push_back(c);
        }
        auto lookahead_bytes = stream_.Take(lookahead);
        RETURN_IF_ERROR(lookahead_bytes.status());
        if (!on_heap.empty()) {
          absl::string_view view = lookahead_bytes->AsView();
          on_heap.append(view.data(), view.size());
        }
        break;
      }
    }
  }

  return Invalid("EOF inside string");
}